

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_type.cpp
# Opt level: O3

spv_result_t spvtools::val::TypePass(ValidationState_t *_,Instruction *inst)

{
  pointer ppVar1;
  ValidationState_t *pVVar2;
  bool bVar3;
  bool bVar4;
  ushort uVar5;
  int32_t iVar6;
  uint uVar7;
  spv_result_t sVar8;
  uint32_t uVar9;
  uint id;
  ExecutionMode EVar10;
  StorageClass SVar11;
  StorageClass SVar12;
  Instruction *pIVar13;
  ulong uVar14;
  const_iterator cVar15;
  const_iterator cVar16;
  pointer puVar17;
  mapped_type *pmVar18;
  mapped_type *pmVar19;
  _Base_ptr p_Var20;
  DiagnosticStream *pDVar21;
  long lVar22;
  pointer ppVar23;
  char *pcVar24;
  Op opcode;
  size_t sVar25;
  uint32_t *puVar26;
  ulong uVar27;
  uint16_t uVar28;
  size_t index;
  _Rb_tree_header *p_Var29;
  uint64_t dim_value;
  vector<unsigned_int,_std::allocator<unsigned_int>_> const_inst;
  int64_t num_components_value;
  __node_gen_type __node_gen;
  undefined1 local_290 [32];
  float local_270;
  size_t local_268;
  __node_base_ptr p_Stack_260;
  ValidationState_t *local_258;
  string local_250;
  uint32_t *local_230;
  string local_228;
  undefined1 local_208 [16];
  _Manager_type local_1f8;
  _Invoker_type_conflict local_1f0;
  _Rb_tree_color local_1e8;
  spv_result_t local_38;
  
  iVar6 = spvOpcodeGeneratesType((uint)(inst->inst_).opcode);
  if ((iVar6 == 0) && ((inst->inst_).opcode != 0x27)) {
    return SPV_SUCCESS;
  }
  bVar3 = EnumSet<spvtools::Extension>::contains
                    (&_->module_extensions_,kSPV_VALIDATOR_ignore_type_decl_unique);
  if (bVar3) {
LAB_00652303:
    uVar28 = (inst->inst_).opcode;
  }
  else {
    uVar28 = (inst->inst_).opcode;
    if ((((0x20 < (ulong)uVar28) || ((0x170000000U >> ((ulong)uVar28 & 0x3f) & 1) == 0)) &&
        (uVar28 != 0x1141)) && (uVar28 != 0x13d4)) {
      bVar3 = ValidationState_t::RegisterUniqueTypeDeclaration(_,inst);
      if (!bVar3) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "Duplicate non-aggregate type declarations are not allowed. Opcode: ",0x43);
        local_290._0_8_ = spvOpcodeString((uint)uVar28);
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_290);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21," id: ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)pDVar21);
        sVar8 = pDVar21->error_;
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
      }
      goto LAB_00652303;
    }
  }
  if (0x1140 < uVar28) {
    if (0x14ed < uVar28) {
      if (uVar28 == 0x14ee) {
LAB_0065275f:
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar13 == (Instruction *)0x0) || (1 < (pIVar13->inst_).opcode - 0x15)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeCooperativeMatrix Component Type <id> ";
          lVar22 = 0x2c;
LAB_006532a7:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
          local_290._8_8_ = 0x20;
          pcVar24 = " is not a scalar numerical type.";
          goto LAB_0065341f;
        }
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if (((pIVar13 == (Instruction *)0x0) ||
            (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar3)) ||
           (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpTypeCooperativeMatrix Scope <id> ",0x23);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
          pcVar24 = " is not a constant instruction with scalar integer type.";
          local_290._8_8_ = 0x38;
          goto LAB_0065341f;
        }
        id = Instruction::GetOperandAs<unsigned_int>(inst,3);
        pIVar13 = ValidationState_t::FindDef(_,id);
        if (((pIVar13 == (Instruction *)0x0) ||
            (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar3)) ||
           (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeCooperativeMatrix Rows <id> ";
LAB_0065423c:
          lVar22 = 0x22;
        }
        else {
          id = Instruction::GetOperandAs<unsigned_int>(inst,4);
          pIVar13 = ValidationState_t::FindDef(_,id);
          if (((pIVar13 == (Instruction *)0x0) ||
              (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar3)) ||
             (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            pcVar24 = "OpTypeCooperativeMatrix Cols <id> ";
            goto LAB_0065423c;
          }
          if ((inst->inst_).opcode != 0x1168) {
LAB_006528c8:
            bVar3 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)&local_228);
            sVar8 = SPV_SUCCESS;
            if ((bVar3) && (local_228._M_dataplus._M_p == (char *)0x2)) {
              puVar26 = (_->entry_points_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start;
              local_230 = (_->entry_points_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
              if (puVar26 != local_230) {
                local_258 = _;
                do {
                  uVar9 = *puVar26;
                  local_208._0_4_ = uVar9;
                  cVar15 = std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(_->entry_point_to_local_size_or_id_)._M_h,
                                  (key_type_conflict *)local_208);
                  pVVar2 = local_258;
                  if (cVar15.
                      super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_false>
                      ._M_cur == (__node_type *)0x0) {
                    ValidationState_t::diag
                              ((DiagnosticStream *)local_208,local_258,SPV_ERROR_INVALID_ID,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,
                               "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ",0x2f);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,
                               "used without specifying LocalSize or LocalSizeId ",0x31);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_208,"for entry point <id> ",0x15);
                    ValidationState_t::getIdName_abi_cxx11_((string *)local_290,pVVar2,uVar9);
                    pcVar24 = (char *)local_290._0_8_;
                    goto LAB_0065341f;
                  }
                  cVar15 = std::
                           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_std::allocator<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                           ::find(&(_->entry_point_to_local_size_or_id_)._M_h,
                                  (key_type_conflict *)local_208);
                  pIVar13 = *(Instruction **)
                             ((long)cVar15.
                                    super__Node_iterator_base<std::pair<const_unsigned_int,_const_spvtools::val::Instruction_*>,_false>
                                    ._M_cur + 0x10);
                  EVar10 = Instruction::GetOperandAs<spv::ExecutionMode>(pIVar13,1);
                  if (EVar10 == ExecutionModeLocalSizeId) {
                    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
                    local_250._M_dataplus._M_p._0_4_ = uVar7;
                    uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,3);
                    local_250._M_dataplus._M_p._4_4_ = uVar7;
                    local_250._M_string_length._0_4_ =
                         Instruction::GetOperandAs<unsigned_int>(pIVar13,4);
                    pVVar2 = local_258;
                    lVar22 = 0;
                    do {
                      uVar9 = *(uint32_t *)((long)&local_250._M_dataplus._M_p + lVar22);
                      pIVar13 = ValidationState_t::FindDef(pVVar2,uVar9);
                      if (inst < pIVar13) {
                        ValidationState_t::diag
                                  ((DiagnosticStream *)local_208,pVVar2,SPV_ERROR_INVALID_ID,inst);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,
                                   "OpTypeCooperativeMatrixKHR with ScopeWorkgroup ",0x2f);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,
                                   "used before LocalSizeId constant value <id> ",0x2c);
                        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,pVVar2,uVar9);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
                        local_290._8_8_ = 0xc;
                        pcVar24 = " is defined.";
                        goto LAB_0065341f;
                      }
                      lVar22 = lVar22 + 4;
                    } while (lVar22 != 0xc);
                  }
                  puVar26 = puVar26 + 1;
                } while (puVar26 != local_230);
                sVar8 = SPV_SUCCESS;
              }
            }
            goto LAB_006542e6;
          }
          id = Instruction::GetOperandAs<unsigned_int>(inst,5);
          pIVar13 = ValidationState_t::FindDef(_,id);
          if (((pIVar13 != (Instruction *)0x0) &&
              (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), bVar3)) &&
             (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 != 0))
          goto LAB_006528c8;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeCooperativeMatrixKHR Use <id> ";
          lVar22 = 0x24;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,id);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
        pcVar24 = " is not a constant instruction with scalar integer type.";
        lVar22 = 0x38;
        goto LAB_0065435d;
      }
      if (uVar28 != 0x14fa) {
        if (uVar28 != 0x14fb) {
          return SPV_SUCCESS;
        }
        sVar8 = anon_unknown_2::ValidateTensorDim(_,inst);
        if (sVar8 != SPV_SUCCESS) {
          return sVar8;
        }
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar13 == (Instruction *)0x0) ||
           (bVar3 = ValidationState_t::IsBoolScalarType(_,(pIVar13->inst_).type_id), !bVar3)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21," HasDimensions <id> ",0x14);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)pDVar21,(char *)local_290._0_8_,local_290._8_8_);
          pcVar24 = " is not a boolean value.";
          lVar22 = 0x18;
LAB_00653913:
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar24,lVar22);
          sVar8 = pDVar21->error_;
          goto LAB_00653436;
        }
        uVar14 = (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(inst->operands_).
                       super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                       ._M_impl.super__Vector_impl_data._M_start;
        local_230 = (uint32_t *)(((long)uVar14 >> 4) + -3);
        uVar27 = (ulong)local_258 >> 0x20;
        local_258 = (ValidationState_t *)(uVar27 << 0x20);
        if (uVar14 < 0x31) {
LAB_006526fd:
          if ((-1 << ((byte)local_230 & 0x1f) ^ (uint)local_258) == 0xffffffff) goto LAB_00654701;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          local_290._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_290);
          pcVar24 = " Permutation values don\'t form a valid permutation.";
          lVar22 = 0x33;
        }
        else {
          bVar3 = true;
          local_258 = (ValidationState_t *)(uVar27 << 0x20);
          sVar25 = 3;
          do {
            while( true ) {
              uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar25);
              pIVar13 = ValidationState_t::FindDef(_,uVar7);
              if (((pIVar13 == (Instruction *)0x0) ||
                  (bVar4 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar4))
                 || (uVar9 = ValidationState_t::GetBitWidth(_,(pIVar13->inst_).type_id),
                    uVar9 != 0x20)) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
                pDVar21 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_208,(char **)&local_250);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21," Permutation <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21,(char *)local_290._0_8_,local_290._8_8_);
                pcVar24 = " is not a 32-bit integer.";
                lVar22 = 0x19;
                goto LAB_00653913;
              }
              bVar4 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)&local_250);
              if (!bVar4) break;
              if (local_230 <= local_250._M_dataplus._M_p) {
                ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
                local_228._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
                pDVar21 = DiagnosticStream::operator<<
                                    ((DiagnosticStream *)local_208,(char **)&local_228);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21," Permutation <id> ",0x12);
                ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)pDVar21,(char *)local_290._0_8_,local_290._8_8_);
                pcVar24 = " must be a valid dimension.";
                lVar22 = 0x1b;
                goto LAB_00653913;
              }
              local_258 = (ValidationState_t *)
                          CONCAT44(local_258._4_4_,
                                   (uint)local_258 | 1 << ((uint)local_250._M_dataplus._M_p & 0x1f))
              ;
              sVar25 = sVar25 + 1;
              if ((ulong)((long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(inst->operands_).
                                super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4) <= sVar25) {
                if (bVar3) goto LAB_006526fd;
                goto LAB_00654701;
              }
            }
            sVar25 = sVar25 + 1;
            bVar3 = false;
          } while (sVar25 < (ulong)((long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(inst->operands_).
                                          super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 4));
LAB_00654701:
          uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
          bVar3 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)local_290);
          sVar8 = SPV_SUCCESS;
          if ((!bVar3) || ((uint32_t *)local_290._0_8_ == local_230)) goto LAB_006542e6;
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
          pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
          pcVar24 = " Incorrect number of permutation values.";
          lVar22 = 0x28;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar24,lVar22);
        sVar8 = pDVar21->error_;
        goto LAB_006542e1;
      }
      sVar8 = anon_unknown_2::ValidateTensorDim(_,inst);
      if (sVar8 != SPV_SUCCESS) {
        return sVar8;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar13 = ValidationState_t::FindDef(_,uVar7);
      if (((pIVar13 == (Instruction *)0x0) ||
          (bVar3 = ValidationState_t::IsIntScalarType(_,(pIVar13->inst_).type_id), !bVar3)) ||
         (uVar9 = ValidationState_t::GetBitWidth(_,(pIVar13->inst_).type_id), uVar9 != 0x20)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        local_250._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_250);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar21," ClampMode <id> ",0x10);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar21,(char *)local_290._0_8_,local_290._8_8_);
        pcVar24 = " is not a 32-bit integer.";
        lVar22 = 0x19;
      }
      else {
        bVar3 = ValidationState_t::EvalConstantValUint64(_,uVar7,(uint64_t *)&local_250);
        sVar8 = SPV_SUCCESS;
        if ((!bVar3) || (local_250._M_dataplus._M_p < (uint32_t *)0x5)) goto LAB_006542e6;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        local_228._M_dataplus._M_p = spvOpcodeString((uint)(inst->inst_).opcode);
        pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)&local_228);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar21," ClampMode <id> ",0x10);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)pDVar21,(char *)local_290._0_8_,local_290._8_8_);
        pcVar24 = " must be a valid TensorClampMode.";
        lVar22 = 0x21;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)pDVar21,pcVar24,lVar22);
      sVar8 = pDVar21->error_;
      goto LAB_00653436;
    }
    if (uVar28 == 0x1141) {
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar3) {
        return SPV_SUCCESS;
      }
      SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      if ((int)SVar12 < 9) {
        if (SVar12 == StorageClassUniform) {
          return SPV_SUCCESS;
        }
        if (SVar12 == StorageClassWorkgroup) {
          bVar3 = EnumSet<spv::Capability>::contains
                            (&_->module_capabilities_,CapabilityWorkgroupMemoryExplicitLayoutKHR);
          if (bVar3) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = 
          "Workgroup storage class untyped pointers in Vulkan require WorkgroupMemoryExplicitLayoutKHR be declared"
          ;
          lVar22 = 0x67;
          goto LAB_006542cf;
        }
      }
      else {
        if (SVar12 == PushConstant) {
          return SPV_SUCCESS;
        }
        if (SVar12 == StorageBuffer) {
          return SPV_SUCCESS;
        }
        if (SVar12 == PhysicalStorageBuffer) {
          return SPV_SUCCESS;
        }
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = 
      "In Vulkan, untyped pointers can only be used in an explicitly laid out storage class";
      goto LAB_006542ca;
    }
    if (uVar28 == 0x1168) goto LAB_0065275f;
    if (uVar28 != 0x14a8) {
      return SPV_SUCCESS;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) || (1 < (pIVar13->inst_).opcode - 0x15)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeCooperativeVectorNV Component Type <id> ";
      lVar22 = 0x2e;
      goto LAB_006532a7;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeCooperativeVectorNV component count <id> ";
      lVar22 = 0x2f;
      goto LAB_00654327;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_250,&pIVar13->words_);
    pIVar13 = ValidationState_t::FindDef(_,*(uint32_t *)(local_250._M_dataplus._M_p + 4));
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x15)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeCooperativeVectorNV component count <id> ";
      lVar22 = 0x2f;
LAB_00654674:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is not a constant integer type.",0x20);
    }
    else {
      bVar3 = ValidationState_t::EvalConstantValInt64(_,uVar7,(int64_t *)&local_228);
      sVar8 = SPV_SUCCESS;
      if ((!bVar3) ||
         ((local_228._M_dataplus._M_p != (char *)0x0 &&
          ((-1 < (long)local_228._M_dataplus._M_p ||
           ((pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_start[3] == 0)))))) goto LAB_006546e1;
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeCooperativeVectorNV component count <id> ";
      lVar22 = 0x2f;
LAB_0065410c:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," default value must be at least 1: found ",0x29);
      std::ostream::_M_insert<long>((long)local_208);
    }
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    sVar8 = local_38;
LAB_006546e1:
    if ((uint32_t *)local_250._M_dataplus._M_p != (uint32_t *)0x0) {
      operator_delete(local_250._M_dataplus._M_p,
                      local_250.field_2._M_allocated_capacity - (long)local_250._M_dataplus._M_p);
    }
    goto LAB_006542e6;
  }
  switch(uVar28) {
  case 0x15:
    uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    switch(uVar7 << 0x1d | uVar7 - 8 >> 3) {
    case 0:
      if ((_->features_).declare_int8_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar24 = 
      "Using an 8-bit integer type requires the Int8 capability, or an extension that explicitly enables 8-bit integers."
      ;
      lVar22 = 0x71;
      break;
    case 1:
      if ((_->features_).declare_int16_type != false) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar24 = 
      "Using a 16-bit integer type requires the Int16 capability, or an extension that explicitly enables 16-bit integers."
      ;
      lVar22 = 0x73;
      break;
    default:
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Invalid number of bits (",0x18);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      pcVar24 = ") used for OpTypeInt.";
      lVar22 = 0x15;
      break;
    case 3:
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      if (uVar7 < 2) {
        if ((inst->inst_).opcode != 0x15) {
          return SPV_SUCCESS;
        }
        bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityKernel);
        if (!bVar3) {
          return SPV_SUCCESS;
        }
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
        if (uVar7 == 0) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_BINARY,inst);
        pcVar24 = "The Signedness in OpTypeInt must always be 0 when Kernel capability is used.";
        lVar22 = 0x4c;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_VALUE,inst);
        pcVar24 = "OpTypeInt has invalid signedness:";
        lVar22 = 0x21;
      }
      break;
    case 7:
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityInt64);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar24 = "Using a 64-bit integer type requires the Int64 capability.";
      lVar22 = 0x3a;
    }
    break;
  case 0x16:
    uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,1);
    if (uVar7 == 0x40) {
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityFloat64);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Using a 64-bit floating point ",0x1e);
      pcVar24 = "type requires the Float64 capability.";
      lVar22 = 0x25;
    }
    else {
      if (uVar7 == 0x20) {
        return SPV_SUCCESS;
      }
      if (uVar7 == 0x10) {
        if ((_->features_).declare_float16_type != false) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Using a 16-bit floating point ",0x1e);
        pcVar24 = 
        "type requires the Float16 or Float16Buffer capability, or an extension that explicitly enables 16-bit floating point."
        ;
        lVar22 = 0x75;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Invalid number of bits (",0x18);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        pcVar24 = ") used for OpTypeFloat.";
        lVar22 = 0x17;
      }
    }
    break;
  case 0x17:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeIsScalarType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"OpTypeVector Component Type <id> ",0x21);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
      pcVar24 = " is not a scalar type.";
LAB_00653390:
      local_290._8_8_ = 0x16;
      goto LAB_0065341f;
    }
    uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
    if (uVar7 - 2 < 3) {
      return SPV_SUCCESS;
    }
    if ((uVar7 == 0x10) || (uVar7 == 8)) {
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityVector16);
      if (bVar3) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Having ",7);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," components for ",0x10);
      local_290._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_290);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)pDVar21," requires the Vector16 capability",0x21);
      sVar8 = pDVar21->error_;
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,"Illegal number of components (",0x1e);
      std::ostream::_M_insert<unsigned_long>((ulong)local_208);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,") for ",6);
      local_290._0_8_ = spvOpcodeString((uint)(inst->inst_).opcode);
      pDVar21 = DiagnosticStream::operator<<((DiagnosticStream *)local_208,(char **)local_290);
      sVar8 = pDVar21->error_;
    }
    goto LAB_006542e1;
  case 0x18:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x17)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "Columns in a matrix must be of type vector.";
      lVar22 = 0x2b;
    }
    else {
      uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
      pIVar13 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar13->inst_).opcode == 0x16) {
        uVar7 = Instruction::GetOperandAs<unsigned_int_const>(inst,2);
        if (0xfffffffc < uVar7 - 5) {
          return SPV_SUCCESS;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar24 = "Matrix types can only be parameterized as having only 2, 3, or 4 columns.";
        lVar22 = 0x49;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar24 = "Matrix types can only be parameterized with floating-point types.";
        lVar22 = 0x41;
      }
    }
    break;
  default:
    goto LAB_006542ec;
  case 0x1c:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 != (Instruction *)0x0) &&
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 != 0)) {
      if ((pIVar13->inst_).opcode == 0x13) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar24 = "OpTypeArray Element Type <id> ";
        lVar22 = 0x1e;
LAB_006531b6:
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
        pcVar24 = " is a void type.";
        local_290._8_8_ = 0x10;
        goto LAB_0065341f;
      }
      bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
      if ((((bVar3) && ((pIVar13->inst_).opcode == 0x1e)) &&
          ((bVar3 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,Block), bVar3 ||
           (bVar3 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,BufferBlock),
           bVar3)))) &&
         (bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride), bVar3))
      goto LAB_00653cab;
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      if ((bVar3) && ((pIVar13->inst_).opcode == 0x1d)) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1248,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
        pcVar24 = "OpTypeArray Element Type <id> ";
        lVar22 = 0x1e;
        goto LAB_00653f69;
      }
      uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
      pIVar13 = ValidationState_t::FindDef(_,uVar7);
      if ((pIVar13 != (Instruction *)0x0) &&
         (iVar6 = spvOpcodeIsConstant((uint)(pIVar13->inst_).opcode), iVar6 != 0)) {
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_250,
                   &pIVar13->words_);
        pIVar13 = ValidationState_t::FindDef(_,*(uint32_t *)(local_250._M_dataplus._M_p + 4));
        if ((pIVar13 == (Instruction *)0x0) || ((pIVar13->inst_).opcode != 0x15)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeArray Length <id> ";
          lVar22 = 0x18;
          goto LAB_00654674;
        }
        bVar3 = ValidationState_t::EvalConstantValInt64(_,uVar7,(int64_t *)&local_228);
        sVar8 = SPV_SUCCESS;
        if ((bVar3) &&
           ((local_228._M_dataplus._M_p == (char *)0x0 ||
            (((long)local_228._M_dataplus._M_p < 0 &&
             ((pIVar13->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start[3] != 0)))))) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeArray Length <id> ";
          lVar22 = 0x18;
          goto LAB_0065410c;
        }
        goto LAB_006546e1;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeArray Length <id> ";
      lVar22 = 0x18;
LAB_00654327:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
      ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
      pcVar24 = " is not a scalar constant type.";
      lVar22 = 0x1f;
LAB_0065435d:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
      sVar8 = local_38;
      goto LAB_00653436;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar24 = "OpTypeArray Element Type <id> ";
    lVar22 = 0x1e;
LAB_006533ea:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
    pcVar24 = " is not a type.";
    local_290._8_8_ = 0xf;
    goto LAB_0065341f;
  case 0x1d:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeRuntimeArray Element Type <id> ";
      lVar22 = 0x25;
      goto LAB_006533ea;
    }
    if ((pIVar13->inst_).opcode == 0x13) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeRuntimeArray Element Type <id> ";
      lVar22 = 0x25;
      goto LAB_006531b6;
    }
    bVar3 = EnumSet<spv::Capability>::contains(&_->module_capabilities_,CapabilityShader);
    if ((((!bVar3) || ((pIVar13->inst_).opcode != 0x1e)) ||
        ((bVar3 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,Block), !bVar3 &&
         (bVar3 = ValidationState_t::HasDecoration(_,(pIVar13->inst_).result_id,BufferBlock), !bVar3
         )))) || (bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,ArrayStride),
                 !bVar3)) {
      bVar3 = spvIsVulkanEnv(_->context_->target_env);
      if (!bVar3) {
        return SPV_SUCCESS;
      }
      if ((pIVar13->inst_).opcode != 0x1d) {
        return SPV_SUCCESS;
      }
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1248,(char *)0x0);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
      pcVar24 = "OpTypeRuntimeArray Element Type <id> ";
      lVar22 = 0x25;
LAB_00653f69:
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
      ValidationState_t::getIdName_abi_cxx11_(&local_250,_,uVar7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_250._M_dataplus._M_p,
                 CONCAT44(local_250._M_string_length._4_4_,(uint)local_250._M_string_length));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208," is not valid in ",0x11);
      spvLogStringForEnv_abi_cxx11_(&local_228,_->context_->target_env);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," environments.",0xe);
      sVar8 = local_38;
LAB_00654589:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_228._M_dataplus._M_p != &local_228.field_2) {
        operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
      }
LAB_006545af:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_250._M_dataplus._M_p != &local_250.field_2) {
        operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1);
      }
      goto LAB_00653436;
    }
LAB_00653cab:
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar24 = "Array containing a Block or BufferBlock must not be decorated with ArrayStride";
    lVar22 = 0x4e;
    break;
  case 0x1e:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    local_258 = (ValidationState_t *)CONCAT44(local_258._4_4_,uVar7);
    if (0x10 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar25 = 1;
      do {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,sVar25);
        if (uVar7 == (inst->inst_).result_id) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "Structure members may not be self references";
          lVar22 = 0x2c;
          goto LAB_006542cf;
        }
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar13 == (Instruction *)0x0) ||
           (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpTypeStruct Member Type <id> ",0x1e);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
          pcVar24 = " is not a type.";
          lVar22 = 0xf;
          goto LAB_0065435d;
        }
        uVar28 = (pIVar13->inst_).opcode;
        if (uVar28 == 0x1e) {
          local_208._0_4_ = uVar7;
          cVar16 = std::
                   _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   ::find(&(_->builtin_structs_)._M_h,(key_type_conflict *)local_208);
          if (cVar16.super__Node_iterator_base<unsigned_int,_false>._M_cur != (__node_type *)0x0) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Structure <id> ",0xf);
            ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,
                       " contains members with BuiltIn decoration. Therefore this ",0x3a);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"structure may not be contained as a member of another "
                       ,0x36);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"structure ",10)
            ;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"type. Structure <id> ",0x15);
            ValidationState_t::getIdName_abi_cxx11_(&local_250,_,(uint)local_258);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_250._M_dataplus._M_p,
                       CONCAT44(local_250._M_string_length._4_4_,(uint)local_250._M_string_length));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," contains structure <id> ",0x19);
            ValidationState_t::getIdName_abi_cxx11_(&local_228,_,uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,".",1);
            sVar8 = local_38;
            goto LAB_00654589;
          }
        }
        else if (uVar28 == 0x13) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "Structures cannot contain a void type.";
          lVar22 = 0x26;
          goto LAB_006542cf;
        }
        bVar3 = spvIsVulkanEnv(_->context_->target_env);
        if ((bVar3) && ((pIVar13->inst_).opcode == 0x1d)) {
          if (sVar25 == ((long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(inst->operands_).
                               super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                               ._M_impl.super__Vector_impl_data._M_start >> 4) - 1U) {
            bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block);
            if ((bVar3) ||
               (bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock),
               bVar3)) goto LAB_00652d13;
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1248,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
            spvLogStringForEnv_abi_cxx11_(&local_250,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_250._M_dataplus._M_p,
                       CONCAT44(local_250._M_string_length._4_4_,(uint)local_250._M_string_length));
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,", OpTypeStruct containing an OpTypeRuntimeArray ",0x30)
            ;
            pcVar24 = "must be decorated with Block or BufferBlock.";
            lVar22 = 0x2c;
          }
          else {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1248,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"In ",3);
            spvLogStringForEnv_abi_cxx11_(&local_250,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_250._M_dataplus._M_p,
                       CONCAT44(local_250._M_string_length._4_4_,(uint)local_250._M_string_length));
            pcVar24 = 
            ", OpTypeRuntimeArray must only be used for the last member of an OpTypeStruct";
            lVar22 = 0x4d;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
          sVar8 = local_38;
          goto LAB_006545af;
        }
LAB_00652d13:
        sVar25 = sVar25 + 1;
      } while (sVar25 < (ulong)((long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(inst->operands_).
                                      super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4));
    }
    puVar17 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((ulong)((long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar17) < 9) {
      bVar3 = false;
    }
    else {
      uVar27 = 2;
      do {
        local_208._8_8_ = (void *)0x0;
        local_1f0 = std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
                    ::_M_invoke;
        local_1f8 = std::
                    _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:423:13)>
                    ::_M_manager;
        local_208._0_8_ = _;
        bVar3 = ValidationState_t::ContainsType
                          (_,puVar17[uVar27],
                           (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)local_208
                           ,false);
        if (local_1f8 != (_Manager_type)0x0) {
          (*local_1f8)((_Any_data *)local_208,(_Any_data *)local_208,__destroy_functor);
        }
        if (bVar3) break;
        uVar27 = uVar27 + 1;
        puVar17 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      } while (uVar27 < (ulong)((long)(inst->words_).
                                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                      ._M_impl.super__Vector_impl_data._M_finish - (long)puVar17 >>
                               2));
    }
    local_208._0_4_ = (inst->inst_).result_id;
    pmVar18 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&_->struct_has_nested_blockorbufferblock_struct_,(key_type *)local_208
                          );
    *pmVar18 = bVar3;
    local_208._0_4_ = (inst->inst_).result_id;
    pmVar18 = std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_bool>,_std::allocator<std::pair<const_unsigned_int,_bool>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                            *)&_->struct_has_nested_blockorbufferblock_struct_,(key_type *)local_208
                          );
    if ((*pmVar18 != true) ||
       ((bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,BufferBlock), !bVar3 &&
        (bVar3 = ValidationState_t::HasDecoration(_,(inst->inst_).result_id,Block), !bVar3)))) {
      local_290._0_8_ = &p_Stack_260;
      local_290._8_8_ = 1;
      local_290._16_8_ = 0;
      local_290._24_8_ = 0;
      local_270 = 1.0;
      local_268 = 0;
      p_Stack_260 = (__node_base_ptr)0x0;
      local_208._0_4_ = (uint)local_258;
      pmVar19 = std::
                map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
                ::operator[](&_->id_decorations_,(key_type_conflict *)local_208);
      p_Var20 = (pmVar19->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var29 = &(pmVar19->_M_t)._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var20 != p_Var29) {
        do {
          local_208._0_4_ = p_Var20[1]._M_color;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(local_208 + 8),
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&p_Var20[1]._M_parent);
          local_1e8 = p_Var20[2]._M_color;
          if ((local_208._0_4_ == 0xb) && (local_1e8 != ~_S_red)) {
            local_228._M_dataplus._M_p._0_4_ = local_1e8;
            local_250._M_dataplus._M_p = local_290;
            std::
            _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
            ::
            _M_insert<unsigned_int,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                      (local_290,
                       (_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                        *)&local_228,&local_250);
          }
          if ((void *)local_208._8_8_ != (void *)0x0) {
            operator_delete((void *)local_208._8_8_,(long)local_1f0 - local_208._8_8_);
          }
          p_Var20 = (_Base_ptr)std::_Rb_tree_increment(p_Var20);
        } while ((_Rb_tree_header *)p_Var20 != p_Var29);
      }
      if (((int)local_290._24_4_ < 1) ||
         ((int)((ulong)((long)(inst->operands_).
                              super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 4) + -1 ==
          local_290._24_4_)) {
        if (0 < (int)local_290._24_4_) {
          local_250._M_dataplus._M_p._0_4_ = (uint)local_258;
          local_208._0_8_ = &_->builtin_structs_;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ();
        }
        bVar3 = spvIsVulkanEnv(_->context_->target_env);
        sVar8 = SPV_SUCCESS;
        if ((bVar3) && (_->options_->before_hlsl_legalization == false)) {
          local_208._8_8_ = (void *)0x0;
          local_1f0 = std::
                      _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                      ::_M_invoke;
          local_1f8 = std::
                      _Function_handler<bool_(const_spvtools::val::Instruction_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/val/validate_type.cpp:469:29)>
                      ::_M_manager;
          local_208._0_8_ = _;
          bVar3 = ValidationState_t::ContainsType
                            (_,(inst->inst_).result_id,
                             (function<bool_(const_spvtools::val::Instruction_*)>_conflict *)
                             local_208,true);
          if (local_1f8 != (_Manager_type)0x0) {
            (*local_1f8)((_Any_data *)local_208,(_Any_data *)local_208,__destroy_functor);
          }
          if (bVar3) {
            ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
            ValidationState_t::VkErrorID_abi_cxx11_(&local_250,_,0x123b,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_250._M_dataplus._M_p,
                       CONCAT44(local_250._M_string_length._4_4_,(uint)local_250._M_string_length));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"In ",3);
            spvLogStringForEnv_abi_cxx11_(&local_228,_->context_->target_env);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,local_228._M_dataplus._M_p,local_228._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,", OpTypeStruct must not contain an opaque type.",0x2f);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_228._M_dataplus._M_p != &local_228.field_2) {
              operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1
                             );
            }
            sVar8 = local_38;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_250._M_dataplus._M_p != &local_250.field_2) {
              operator_delete(local_250._M_dataplus._M_p,local_250.field_2._M_allocated_capacity + 1
                             );
            }
            goto LAB_00653890;
          }
        }
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "When BuiltIn decoration is applied to a structure-type member, ",0x3f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "all members of that structure type must also be decorated with ",0x3f);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"BuiltIn (No allowed mixing of built-in variables and ",0x35
                  );
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   "non-built-in variables within a single structure). Structure id ",0x40);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," does not meet this requirement.",0x20);
        sVar8 = local_38;
LAB_00653890:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
      }
      std::
      _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
      ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                     *)local_290);
      goto LAB_006542e6;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
    pcVar24 = "rules: A Block or BufferBlock cannot be nested within another Block or BufferBlock. "
    ;
LAB_006542ca:
    lVar22 = 0x54;
    break;
  case 0x20:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,2);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypePointer Type <id> ";
      lVar22 = 0x18;
      goto LAB_006533ea;
    }
    SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
    if (SVar12 == StorageClassUniformConstant) {
      uVar5 = (pIVar13->inst_).opcode;
      if ((uVar5 & 0xfffe) == 0x1c) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,1);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        uVar5 = (pIVar13->inst_).opcode;
      }
      if ((uVar5 == 0x19) &&
         (uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,6), uVar7 == 2)) {
        local_290._0_4_ = (inst->inst_).result_id;
        local_208._0_8_ = &_->pointer_to_storage_image_;
        std::
        _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
        ::
        _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                  ();
      }
    }
    bVar3 = ValidationState_t::IsValidStorageClass(_,SVar12);
    if (bVar3) {
      return SPV_SUCCESS;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_BINARY,inst);
    ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1223,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
    pcVar24 = "Invalid storage class for target environment";
    local_290._8_8_ = 0x2c;
    goto LAB_0065341f;
  case 0x21:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,1);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13 == (Instruction *)0x0) ||
       (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "OpTypeFunction Return Type <id> ";
      lVar22 = 0x20;
      goto LAB_006533ea;
    }
    if (0x20 < (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(inst->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      sVar25 = 2;
      do {
        index = sVar25;
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,index);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar13 == (Instruction *)0x0) ||
           (iVar6 = spvOpcodeGeneratesType((uint)(pIVar13->inst_).opcode), iVar6 == 0)) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          pcVar24 = "OpTypeFunction Parameter Type <id> ";
          lVar22 = 0x23;
          goto LAB_006533ea;
        }
        if ((pIVar13->inst_).opcode == 0x13) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"OpTypeFunction Parameter Type <id> ",0x23);
          ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
          pcVar24 = " cannot be OpTypeVoid.";
          goto LAB_00653390;
        }
        sVar25 = index + 1;
      } while (index + 1 <
               (ulong)((long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(inst->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 4));
      if ((ulong)(_->options_->universal_limits_).max_function_args <= index - 2) {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"OpTypeFunction may not take more than ",0x26);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," arguments. OpTypeFunction <id> ",0x20);
        uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
        ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,uVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208," has ",5);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        pcVar24 = " arguments.";
        lVar22 = 0xb;
        goto LAB_0065435d;
      }
    }
    ppVar23 = (inst->uses_).
              super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    ppVar1 = (inst->uses_).
             super__Vector_base<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>,_std::allocator<std::pair<const_spvtools::val::Instruction_*,_unsigned_int>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    while( true ) {
      if (ppVar23 == ppVar1) {
        return SPV_SUCCESS;
      }
      pIVar13 = ppVar23->first;
      opcode = (Op)(pIVar13->inst_).opcode;
      if ((((opcode != OpFunction) && (bVar3 = spvOpcodeIsDebug(opcode), !bVar3)) &&
          (bVar3 = Instruction::IsNonSemantic(pIVar13), !bVar3)) &&
         (bVar3 = spvOpcodeIsDecoration((uint)(pIVar13->inst_).opcode), !bVar3)) break;
      ppVar23 = ppVar23 + 1;
    }
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,pIVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,"Invalid use of function type result id ",0x27);
    ValidationState_t::getIdName_abi_cxx11_((string *)local_290,_,(inst->inst_).result_id);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
    pcVar24 = ".";
    local_290._8_8_ = 1;
LAB_0065341f:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,local_290._8_8_)
    ;
    sVar8 = local_38;
LAB_00653436:
    if ((undefined1 *)local_290._0_8_ != local_290 + 0x10) {
      operator_delete((void *)local_290._0_8_,local_290._16_8_ + 1);
    }
    goto LAB_006542e1;
  case 0x27:
    uVar7 = Instruction::GetOperandAs<unsigned_int>(inst,0);
    pIVar13 = ValidationState_t::FindDef(_,uVar7);
    if ((pIVar13->inst_).opcode == 0x20) {
      SVar12 = Instruction::GetOperandAs<spv::StorageClass>(inst,1);
      SVar11 = Instruction::GetOperandAs<spv::StorageClass>(pIVar13,1);
      if (SVar12 == SVar11) {
        uVar7 = Instruction::GetOperandAs<unsigned_int>(pIVar13,2);
        pIVar13 = ValidationState_t::FindDef(_,uVar7);
        if ((pIVar13 != (Instruction *)0x0) && ((pIVar13->inst_).opcode == 0x1e)) {
          bVar3 = spvIsVulkanEnv(_->context_->target_env);
          if (SVar12 == PhysicalStorageBuffer) {
            return SPV_SUCCESS;
          }
          if (!bVar3) {
            return SPV_SUCCESS;
          }
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_290,_,0x1267,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_290._0_8_,local_290._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"In Vulkan, OpTypeForwardPointer must have ",0x2a);
          pcVar24 = "a storage class of PhysicalStorageBuffer.";
          local_290._8_8_ = 0x29;
          goto LAB_0065341f;
        }
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        pcVar24 = "Forward pointers must point to a structure";
        lVar22 = 0x2a;
      }
      else {
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Storage class in OpTypeForwardPointer does not match the ",
                   0x39);
        pcVar24 = "pointer definition.";
        lVar22 = 0x13;
      }
    }
    else {
      ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_ID,inst);
      pcVar24 = "Pointer type in OpTypeForwardPointer is not a pointer type.";
      lVar22 = 0x3b;
    }
  }
LAB_006542cf:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar24,lVar22);
  sVar8 = local_38;
LAB_006542e1:
  DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
LAB_006542e6:
  if (sVar8 != SPV_SUCCESS) {
    return sVar8;
  }
LAB_006542ec:
  return SPV_SUCCESS;
}

Assistant:

spv_result_t TypePass(ValidationState_t& _, const Instruction* inst) {
  if (!spvOpcodeGeneratesType(inst->opcode()) &&
      inst->opcode() != spv::Op::OpTypeForwardPointer) {
    return SPV_SUCCESS;
  }

  if (auto error = ValidateUniqueness(_, inst)) return error;

  switch (inst->opcode()) {
    case spv::Op::OpTypeInt:
      if (auto error = ValidateTypeInt(_, inst)) return error;
      break;
    case spv::Op::OpTypeFloat:
      if (auto error = ValidateTypeFloat(_, inst)) return error;
      break;
    case spv::Op::OpTypeVector:
      if (auto error = ValidateTypeVector(_, inst)) return error;
      break;
    case spv::Op::OpTypeMatrix:
      if (auto error = ValidateTypeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeArray:
      if (auto error = ValidateTypeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeRuntimeArray:
      if (auto error = ValidateTypeRuntimeArray(_, inst)) return error;
      break;
    case spv::Op::OpTypeStruct:
      if (auto error = ValidateTypeStruct(_, inst)) return error;
      break;
    case spv::Op::OpTypePointer:
      if (auto error = ValidateTypePointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeFunction:
      if (auto error = ValidateTypeFunction(_, inst)) return error;
      break;
    case spv::Op::OpTypeForwardPointer:
      if (auto error = ValidateTypeForwardPointer(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeMatrixNV:
    case spv::Op::OpTypeCooperativeMatrixKHR:
      if (auto error = ValidateTypeCooperativeMatrix(_, inst)) return error;
      break;
    case spv::Op::OpTypeCooperativeVectorNV:
      if (auto error = ValidateTypeCooperativeVectorNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeUntypedPointerKHR:
      if (auto error = ValidateTypeUntypedPointerKHR(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorLayoutNV:
      if (auto error = ValidateTypeTensorLayoutNV(_, inst)) return error;
      break;
    case spv::Op::OpTypeTensorViewNV:
      if (auto error = ValidateTypeTensorViewNV(_, inst)) return error;
      break;
    default:
      break;
  }

  return SPV_SUCCESS;
}